

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ehooks.c
# Opt level: O3

void * ehooks_default_alloc
                 (extent_hooks_t *extent_hooks,void *new_addr,size_t size,size_t alignment,
                 _Bool *zero,_Bool *commit,uint arena_ind)

{
  tsd_t *tsd;
  void *pvVar1;
  long *in_FS_OFFSET;
  
  if (duckdb_je_tsd_booted) {
    tsd = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
    if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
      tsd = duckdb_je_tsd_fetch_slow(tsd,false);
    }
  }
  else {
    tsd = (tsd_t *)0x0;
  }
  pvVar1 = duckdb_je_ehooks_default_alloc_impl
                     ((tsdn_t *)tsd,new_addr,size,alignment + 0xfff & 0xfffffffffffff000,zero,commit
                      ,arena_ind);
  return pvVar1;
}

Assistant:

static void *
ehooks_default_alloc(extent_hooks_t *extent_hooks, void *new_addr, size_t size,
    size_t alignment, bool *zero, bool *commit, unsigned arena_ind) {
	return ehooks_default_alloc_impl(tsdn_fetch(), new_addr, size,
	    ALIGNMENT_CEILING(alignment, PAGE), zero, commit, arena_ind);
}